

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

uint16_t nni_url_default_port(char *scheme)

{
  char cVar1;
  bool bVar2;
  uint16_t in_AX;
  int iVar3;
  size_t __n;
  char *__s;
  long lVar4;
  
  __s = "git";
  lVar4 = 0x10;
  while( true ) {
    __n = strlen(__s);
    iVar3 = strncmp(__s,scheme,__n);
    bVar2 = false;
    if ((iVar3 == 0) &&
       ((cVar1 = scheme[__n], cVar1 == '\0' ||
        (((bVar2 = false, cVar1 == '6' || (cVar1 == '4')) && (scheme[__n + 1] == '\0')))))) {
      in_AX = *(uint16_t *)(sock_stats_init_rx_bytes_info + lVar4 + 0x18);
      bVar2 = true;
    }
    if (bVar2) break;
    __s = *(char **)((long)&nni_url_default_ports[0].scheme + lVar4);
    lVar4 = lVar4 + 0x10;
    if (lVar4 == 0xd0) {
      return 0;
    }
  }
  return in_AX;
}

Assistant:

uint16_t
nni_url_default_port(const char *scheme)
{
	const char *s;

	for (int i = 0; (s = nni_url_default_ports[i].scheme) != NULL; i++) {
		size_t l = strlen(s);
		if (strncmp(s, scheme, strlen(s)) != 0) {
			continue;
		}
		// It can have a suffix of either "4" or "6" to restrict
		// the address family.  This is an NNG extension.
		switch (scheme[l]) {
		case '\0':
			return (nni_url_default_ports[i].port);
		case '4':
		case '6':
			if (scheme[l + 1] == '\0') {
				return (nni_url_default_ports[i].port);
			}
			break;
		}
	}
	return (0);
}